

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void __thiscall QPDFJob::setWriterOptions(QPDFJob *this,QPDFWriter *w)

{
  element_type *peVar1;
  FunctionProgressReporter *this_00;
  element_type *peVar2;
  element_type *peVar3;
  char *__s;
  int extension_level;
  unique_ptr<QPDF,_std::default_delete<QPDF>_> encryption_pdf;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  shared_ptr<QPDFWriter::ProgressReporter> local_70;
  shared_ptr<QPDFWriter::ProgressReporter> local_60;
  function<void_(int)> local_50;
  
  peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (-1 < peVar3->compression_level) {
    Pl_Flate::setCompressionLevel(peVar3->compression_level);
    peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (peVar3->qdf_mode == true) {
    QPDFWriter::setQDFMode(w,true);
    peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (peVar3->preserve_unreferenced_objects == true) {
    QPDFWriter::setPreserveUnreferencedObjects(w,true);
    peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (peVar3->newline_before_endstream == true) {
    QPDFWriter::setNewlineBeforeEndstream(w,true);
    peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (peVar3->normalize_set == true) {
    QPDFWriter::setContentNormalization(w,peVar3->normalize);
    peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (peVar3->stream_data_set == true) {
    QPDFWriter::setStreamDataMode(w,peVar3->stream_data_mode);
    peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (peVar3->compress_streams_set == true) {
    QPDFWriter::setCompressStreams(w,peVar3->compress_streams);
    peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (peVar3->recompress_flate_set == true) {
    QPDFWriter::setRecompressFlate(w,peVar3->recompress_flate);
    peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (peVar3->decode_level_set == true) {
    QPDFWriter::setDecodeLevel(w,peVar3->decode_level);
    peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (peVar3->decrypt == true) {
    QPDFWriter::setPreserveEncryption(w,false);
    peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (peVar3->deterministic_id == true) {
    QPDFWriter::setDeterministicID(w,true);
    peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (peVar3->static_id == true) {
    QPDFWriter::setStaticID(w,true);
    peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (peVar3->static_aes_iv == true) {
    QPDFWriter::setStaticAesIV(w,true);
    peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (peVar3->suppress_original_object_id == true) {
    QPDFWriter::setSuppressOriginalObjectIDs(w,true);
    peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (peVar3->copy_encryption == true) {
    encryption_pdf._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
    super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.super__Head_base<0UL,_QPDF_*,_false>.
    _M_head_impl = (__uniq_ptr_data<QPDF,_std::default_delete<QPDF>,_true,_true>)
                   (__uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>)0x0;
    processFile(this,&encryption_pdf,(peVar3->encryption_file)._M_dataplus._M_p,
                (peVar3->encryption_file_password).
                super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,false,false);
    QPDFWriter::copyEncryptionParameters
              (w,(QPDF *)encryption_pdf._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>
                         ._M_t.super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
                         super__Head_base<0UL,_QPDF_*,_false>._M_head_impl);
    std::unique_ptr<QPDF,_std::default_delete<QPDF>_>::~unique_ptr(&encryption_pdf);
    peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (peVar3->encrypt == true) {
    setEncryptionOptions(this,w);
    peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (peVar3->linearize == true) {
    QPDFWriter::setLinearization(w,true);
    peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if ((peVar3->linearize_pass1)._M_string_length != 0) {
    QPDFWriter::setLinearizationPass1Filename(w,&peVar3->linearize_pass1);
    peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (peVar3->object_stream_set == true) {
    QPDFWriter::setObjectStreamMode(w,peVar3->object_stream_mode);
    peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  QPDFWriter::setMinimumPDFVersion(w,&peVar3->max_input_version);
  peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar3->min_version)._M_string_length != 0) {
    encryption_pdf._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
    super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.super__Head_base<0UL,_QPDF_*,_false>.
    _M_head_impl = (__uniq_ptr_data<QPDF,_std::default_delete<QPDF>,_true,_true>)&local_80;
    local_88._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_80._M_local_buf[0] = '\0';
    extension_level = 0;
    parse_version(&peVar3->min_version,(string *)&encryption_pdf,&extension_level);
    QPDFWriter::setMinimumPDFVersion(w,(string *)&encryption_pdf,extension_level);
    std::__cxx11::string::~string((string *)&encryption_pdf);
    peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if ((peVar3->force_version)._M_string_length != 0) {
    encryption_pdf._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
    super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.super__Head_base<0UL,_QPDF_*,_false>.
    _M_head_impl = (__uniq_ptr_data<QPDF,_std::default_delete<QPDF>,_true,_true>)&local_80;
    local_88._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_80._M_local_buf[0] = '\0';
    extension_level = 0;
    parse_version(&peVar3->force_version,(string *)&encryption_pdf,&extension_level);
    QPDFWriter::forcePDFVersion(w,(string *)&encryption_pdf,extension_level);
    std::__cxx11::string::~string((string *)&encryption_pdf);
    peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (peVar3->progress == true) {
    if ((peVar3->progress_handler).super__Function_base._M_manager == (_Manager_type)0x0) {
      peVar1 = (peVar3->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      __s = "standard output";
      if (peVar1 != (element_type *)0x0) {
        __s = peVar1;
      }
      peVar2 = (element_type *)operator_new(0x50);
      QPDFLogger::getInfo((QPDFLogger *)&encryption_pdf,
                          SUB81((peVar3->log).
                                super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0)
                         );
      peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar2->_vptr_ProgressReporter = (_func_int **)&PTR__ProgressReporter_002b0878;
      peVar2[1]._vptr_ProgressReporter =
           (_func_int **)
           encryption_pdf._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
           super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
           super__Head_base<0UL,_QPDF_*,_false>._M_head_impl;
      std::__cxx11::string::string((string *)(peVar2 + 2),(string *)&peVar3->message_prefix);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(peVar2 + 6),__s,(allocator<char> *)&extension_level);
      local_70.super___shared_ptr<QPDFWriter::ProgressReporter,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_70.super___shared_ptr<QPDFWriter::ProgressReporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar2;
      local_70.super___shared_ptr<QPDFWriter::ProgressReporter,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
      (local_70.super___shared_ptr<QPDFWriter::ProgressReporter,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count = 1;
      (local_70.super___shared_ptr<QPDFWriter::ProgressReporter,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count = 1;
      (local_70.super___shared_ptr<QPDFWriter::ProgressReporter,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_002b0b30;
      local_70.super___shared_ptr<QPDFWriter::ProgressReporter,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)peVar2;
      QPDFWriter::registerProgressReporter(w,&local_70);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_70.
                  super___shared_ptr<QPDFWriter::ProgressReporter,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
    }
    else {
      this_00 = (FunctionProgressReporter *)operator_new(0x28);
      std::function<void_(int)>::function(&local_50,&peVar3->progress_handler);
      QPDFWriter::FunctionProgressReporter::FunctionProgressReporter(this_00,&local_50);
      std::__shared_ptr<QPDFWriter::ProgressReporter,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<QPDFWriter::FunctionProgressReporter,void>
                ((__shared_ptr<QPDFWriter::ProgressReporter,(__gnu_cxx::_Lock_policy)2> *)&local_60,
                 this_00);
      QPDFWriter::registerProgressReporter(w,&local_60);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_60.
                  super___shared_ptr<QPDFWriter::ProgressReporter,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::_Function_base::~_Function_base(&local_50.super__Function_base);
    }
  }
  return;
}

Assistant:

void
QPDFJob::setWriterOptions(QPDFWriter& w)
{
    if (m->compression_level >= 0) {
        Pl_Flate::setCompressionLevel(m->compression_level);
    }
    if (m->qdf_mode) {
        w.setQDFMode(true);
    }
    if (m->preserve_unreferenced_objects) {
        w.setPreserveUnreferencedObjects(true);
    }
    if (m->newline_before_endstream) {
        w.setNewlineBeforeEndstream(true);
    }
    if (m->normalize_set) {
        w.setContentNormalization(m->normalize);
    }
    if (m->stream_data_set) {
        w.setStreamDataMode(m->stream_data_mode);
    }
    if (m->compress_streams_set) {
        w.setCompressStreams(m->compress_streams);
    }
    if (m->recompress_flate_set) {
        w.setRecompressFlate(m->recompress_flate);
    }
    if (m->decode_level_set) {
        w.setDecodeLevel(m->decode_level);
    }
    if (m->decrypt) {
        w.setPreserveEncryption(false);
    }
    if (m->deterministic_id) {
        w.setDeterministicID(true);
    }
    if (m->static_id) {
        w.setStaticID(true);
    }
    if (m->static_aes_iv) {
        w.setStaticAesIV(true);
    }
    if (m->suppress_original_object_id) {
        w.setSuppressOriginalObjectIDs(true);
    }
    if (m->copy_encryption) {
        std::unique_ptr<QPDF> encryption_pdf;
        processFile(
            encryption_pdf,
            m->encryption_file.c_str(),
            m->encryption_file_password.get(),
            false,
            false);
        w.copyEncryptionParameters(*encryption_pdf);
    }
    if (m->encrypt) {
        setEncryptionOptions(w);
    }
    if (m->linearize) {
        w.setLinearization(true);
    }
    if (!m->linearize_pass1.empty()) {
        w.setLinearizationPass1Filename(m->linearize_pass1);
    }
    if (m->object_stream_set) {
        w.setObjectStreamMode(m->object_stream_mode);
    }
    w.setMinimumPDFVersion(m->max_input_version);
    if (!m->min_version.empty()) {
        std::string version;
        int extension_level = 0;
        parse_version(m->min_version, version, extension_level);
        w.setMinimumPDFVersion(version, extension_level);
    }
    if (!m->force_version.empty()) {
        std::string version;
        int extension_level = 0;
        parse_version(m->force_version, version, extension_level);
        w.forcePDFVersion(version, extension_level);
    }
    if (m->progress) {
        if (m->progress_handler) {
            w.registerProgressReporter(
                std::shared_ptr<QPDFWriter::ProgressReporter>(
                    new QPDFWriter::FunctionProgressReporter(m->progress_handler)));
        } else {
            char const* outfilename = m->outfilename ? m->outfilename.get() : "standard output";
            w.registerProgressReporter(
                std::shared_ptr<QPDFWriter::ProgressReporter>(
                    // line-break
                    new ProgressReporter(*m->log->getInfo(), m->message_prefix, outfilename)));
        }
    }
}